

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_type __thiscall llvm::StringRef::find_last_not_of(StringRef *this,StringRef Chars,size_t From)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  unsigned_long *puVar4;
  size_type e_1;
  size_type i_1;
  size_type e;
  size_type i;
  bitset<256UL> CharBits;
  size_t From_local;
  StringRef *this_local;
  StringRef Chars_local;
  
  Chars_local.Data = (char *)Chars.Length;
  this_local = (StringRef *)Chars.Data;
  CharBits.super__Base_bitset<4UL>._M_w[3] = From;
  std::bitset<256UL>::bitset((bitset<256UL> *)&i);
  pcVar1 = Chars_local.Data;
  for (e = 0; (char *)e != pcVar1; e = e + 1) {
    bVar2 = operator[]((StringRef *)&this_local,e);
    std::bitset<256UL>::set((bitset<256UL> *)&i,(ulong)bVar2,true);
  }
  puVar4 = std::min<unsigned_long>(CharBits.super__Base_bitset<4UL>._M_w + 3,&this->Length);
  e_1 = *puVar4;
  do {
    e_1 = e_1 - 1;
    if (e_1 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    bVar3 = std::bitset<256UL>::test((bitset<256UL> *)&i,(ulong)(byte)this->Data[e_1]);
  } while (bVar3);
  return e_1;
}

Assistant:

StringRef::size_type StringRef::find_last_not_of(StringRef Chars,
                                                 size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0, e = Chars.size(); i != e; ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length) - 1, e = -1; i != e; --i)
    if (!CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}